

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadalloc.h
# Opt level: O1

void snmalloc::ThreadAlloc::teardown(void)

{
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *pAVar1;
  undefined8 *in_FS_OFFSET;
  
  pAVar1 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
           *in_FS_OFFSET;
  if (pAVar1 != &default_alloc) {
    *(undefined1 *)in_FS_OFFSET = 1;
    Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::flush
              (pAVar1,false);
    pAVar1 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
             *in_FS_OFFSET;
    LOCK();
    (pAVar1->
    super_conditional_t<StandardConfigClientMeta<>::Options_AllocIsPoolAllocated,_Pooled<Allocator<StandardConfigClientMeta<NoClientMetaDataProvider>_>_>,_Empty>
    ).in_use._M_base._M_i = false;
    UNLOCK();
    Pool<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::ConstructAllocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>,_&snmalloc::StandardConfigClientMeta<>::pool>
    ::restore(pAVar1,pAVar1);
    *in_FS_OFFSET = &default_alloc;
  }
  return;
}

Assistant:

static void teardown()
    {
      // No work required for teardown.
      if (alloc == &default_alloc)
        return;

      teardown_called = true;
      alloc->flush();
      AllocPool<Config>::release(alloc);
      alloc = const_cast<Alloc*>(&default_alloc);
    }